

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O1

int imcomp_write_nocompress_tile
              (fitsfile *outfptr,long row,int datatype,void *tiledata,long tilelen,int nullcheck,
              void *nullflagval,int *status)

{
  undefined8 in_RAX;
  undefined4 uStack_38;
  char coltype [4];
  
  _uStack_38 = in_RAX;
  if (outfptr->Fptr->cn_uncompressed < 1) {
    uStack_38 = (undefined4)in_RAX;
    if (datatype == 0x2a) {
      _uStack_38 = CONCAT44(0x455131,uStack_38);
    }
    else if (datatype == 0x1f) {
      _uStack_38 = CONCAT44(0x4a5031,uStack_38);
    }
    else {
      if (datatype != 0x15) {
        ffpmsg("NOCOMPRESSION option only supported for int*2, int*4, and float*4 images");
        *status = 0x19d;
        return 0x19d;
      }
      _uStack_38 = CONCAT44(0x495031,uStack_38);
    }
    fficol(outfptr,999,"UNCOMPRESSED_DATA",coltype,status);
  }
  ffgcno(outfptr,0,"UNCOMPRESSED_DATA",&outfptr->Fptr->cn_uncompressed,status);
  ffpcl(outfptr,datatype,outfptr->Fptr->cn_uncompressed,row,1,tilelen,tiledata,status);
  return *status;
}

Assistant:

int imcomp_write_nocompress_tile(fitsfile *outfptr,
    long row,
    int datatype, 
    void *tiledata, 
    long tilelen,
    int nullcheck,
    void *nullflagval,
    int *status)
{
    char coltype[4];

    /* Write the uncompressed image tile pixels to the tile-compressed image file. */
    /* This is a special case when using NOCOMPRESS for diagnostic purposes in fpack. */ 
    /* Currently, this only supports a limited number of data types and */
    /* does not fully support null-valued pixels in the image. */

    if ((outfptr->Fptr)->cn_uncompressed < 1) {
        /* uncompressed data column doesn't exist, so append new column to table */
        if (datatype == TSHORT) {
	    strcpy(coltype, "1PI");
	} else if (datatype == TINT) {
	    strcpy(coltype, "1PJ");
	} else if (datatype == TFLOAT) {
	    strcpy(coltype, "1QE");
        } else {
	    ffpmsg("NOCOMPRESSION option only supported for int*2, int*4, and float*4 images");
            return(*status = DATA_COMPRESSION_ERR);
        }

        fits_insert_col(outfptr, 999, "UNCOMPRESSED_DATA", coltype, status); /* create column */
    }

    fits_get_colnum(outfptr, CASEINSEN, "UNCOMPRESSED_DATA",
                    &(outfptr->Fptr)->cn_uncompressed, status);  /* save col. num. */
    
    fits_write_col(outfptr, datatype, (outfptr->Fptr)->cn_uncompressed, row, 1,
                      tilelen, tiledata, status);  /* write the tile data */
    return (*status);
}